

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_get_var_nentry_test(void)

{
  size_t sVar1;
  undefined8 local_1a8;
  btree_kv_ops *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  void **in_stack_fffffffffffffe70;
  undefined1 auStack_128 [8];
  undefined4 in_stack_fffffffffffffee0;
  uint16_t in_stack_fffffffffffffee4;
  uint8_t in_stack_fffffffffffffee6;
  uint8_t in_stack_fffffffffffffee7;
  key_len_t in_stack_fffffffffffffeee;
  char *in_stack_fffffffffffffef0;
  void *vars [2];
  char *node_str;
  void **key_ptrs;
  char *pcStack_b8;
  int n;
  char *keys [6];
  long local_80;
  void *k_out;
  int i;
  int cmp;
  idx_t idx;
  uint8_t v_out;
  uint8_t v;
  uint8_t vsize;
  undefined8 *puStack_68;
  uint8_t ksize;
  btree_kv_ops *kv_ops;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  local_80 = 0;
  keys[3] = "123231234242423428492342";
  keys[4] = "string with space";
  keys[1] = "longerstring";
  keys[2] = "";
  pcStack_b8 = "string";
  keys[0] = "longstring";
  for (k_out._0_4_ = 0; (int)k_out < 6; k_out._0_4_ = (int)k_out + 1) {
    strlen(keys[(long)(int)k_out + -1]);
    construct_key_ptr(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee,
                      (void *)CONCAT17(in_stack_fffffffffffffee7,
                                       CONCAT16(in_stack_fffffffffffffee6,
                                                CONCAT24(in_stack_fffffffffffffee4,
                                                         in_stack_fffffffffffffee0))));
  }
  sVar1 = strlen(pcStack_b8);
  cmp._3_1_ = (char)sVar1 + '\x03';
  cmp._2_1_ = 1;
  kv_ops = (btree_kv_ops *)
           dummy_node(in_stack_fffffffffffffee7,in_stack_fffffffffffffee6,in_stack_fffffffffffffee4)
  ;
  *(idx_t *)((long)&kv_ops->get_kv + 6) = 6;
  cmp._1_1_ = 'd';
  puStack_68 = &local_1a8;
  btree_str_kv_get_kb64_vb64(in_stack_fffffffffffffe60);
  for (i._2_2_ = 0; i._2_2_ < 6; i._2_2_ = i._2_2_ + 1) {
    (*(code *)puStack_68[1])(kv_ops,i._2_2_,auStack_128 + (ulong)i._2_2_ * 8,(long)&cmp + 1);
    cmp._1_1_ = cmp._1_1_ + '\x01';
  }
  cmp._1_1_ = 'd';
  i._2_2_ = 0;
  do {
    if (5 < i._2_2_) {
      freevars(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      freevars(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      memleak_end();
      if (kv_get_var_nentry_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","kv_get_var_nentry_test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","kv_get_var_nentry_test");
      }
      return;
    }
    (*(code *)*puStack_68)(kv_ops,i._2_2_,&local_80,&cmp);
    k_out._4_4_ = strcmp((char *)(local_80 + 2),keys[(ulong)i._2_2_ - 1]);
    if (k_out._4_4_ != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
              ,0x213);
      kv_get_var_nentry_test::__test_pass = 0;
      if (k_out._4_4_ != 0) {
        __assert_fail("cmp == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                      ,0x213,"void kv_get_var_nentry_test()");
      }
    }
    k_out._4_4_ = memcmp(&cmp,(void *)((long)&cmp + 1),(ulong)cmp._2_1_);
    if (k_out._4_4_ != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
              ,0x215);
      kv_get_var_nentry_test::__test_pass = 0;
      if (k_out._4_4_ != 0) {
        __assert_fail("cmp == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                      ,0x215,"void kv_get_var_nentry_test()");
      }
    }
    cmp._1_1_ = cmp._1_1_ + '\x01';
    i._2_2_ = i._2_2_ + 1;
  } while( true );
}

Assistant:

void kv_get_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v, v_out;
    idx_t idx;
    int cmp, i;
    void *k_out = NULL;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string with space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set n keys
    for (idx = 0; idx < n; idx ++){
        kv_ops->set_kv(node, idx, &key_ptrs[idx], (void *)&v);
        v++;
    }

    // get n keys
    v = 100;
    for (idx = 0; idx < n; idx ++){
        kv_ops->get_kv(node, idx, &k_out, (void *)&v_out);
        char *node_str = (char *)((uint8_t *)k_out + sizeof(key_len_t));
        cmp = strcmp(node_str, keys[idx]);
        TEST_CHK(cmp == 0);
        cmp = memcmp(&v_out, &v, vsize);
        TEST_CHK(cmp == 0);
        v++;
    }


    void *vars[] = {(void *)node, k_out};
    freevars(vars, sizeof(vars)/sizeof(void *));
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_get_var_nentry_test");
}